

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O2

idx_t duckdb::Contains<unsigned_int,duckdb::ContainsUnaligned>
                (uchar *haystack,idx_t haystack_size,uchar *needle,idx_t needle_size,
                idx_t base_offset)

{
  int iVar1;
  bool bVar2;
  int *haystack_00;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  
  if (needle_size <= haystack_size) {
    uVar4 = (haystack_size - needle_size) + 1;
    iVar1 = *(int *)needle;
    uVar3 = 0;
    while ((__n = uVar4 - uVar3, uVar3 <= uVar4 && __n != 0 &&
           (haystack_00 = (int *)memchr(haystack + uVar3,(uint)*needle,__n),
           haystack_00 != (int *)0x0))) {
      if ((iVar1 == *haystack_00) &&
         (bVar2 = ContainsUnaligned::MatchRemainder<unsigned_int>
                            ((uchar *)haystack_00,needle,needle_size), bVar2)) {
        return (long)haystack_00 + (base_offset - (long)haystack);
      }
      uVar3 = (long)haystack_00 + (1 - (long)haystack);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static idx_t Contains(const unsigned char *haystack, idx_t haystack_size, const unsigned char *needle,
                      idx_t needle_size, idx_t base_offset) {
	if (needle_size > haystack_size) {
		// needle is bigger than haystack: haystack cannot contain needle
		return DConstants::INVALID_INDEX;
	}
	haystack_size -= needle_size - 1;
	auto needle_entry = Load<UNSIGNED>(needle);
	for (idx_t offset = 0; offset < haystack_size; offset++) {
		// start off by performing a memchr to find the first character of the
		auto location =
		    static_cast<const unsigned char *>(memchr(haystack + offset, needle[0], haystack_size - offset));
		if (!location) {
			return DConstants::INVALID_INDEX;
		}
		// for this position we first compare the haystack with the needle
		offset = UnsafeNumericCast<idx_t>(location - haystack);
		auto haystack_entry = Load<UNSIGNED>(location);
		if (needle_entry == haystack_entry) {
			if (OP::template MatchRemainder<UNSIGNED>(location, needle, needle_size)) {
				return base_offset + offset;
			}
		}
	}
	return DConstants::INVALID_INDEX;
}